

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

void qDefaultMessageHandler(QtMsgType type,QMessageLogContext *context,QString *message)

{
  QString *formattedMessage;
  QMessageLogContext *context_00;
  long in_FS_OFFSET;
  QString local_28;
  long local_10;
  
  context_00 = (QMessageLogContext *)(ulong)type;
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  formatLogMessage(&local_28,type,context,message);
  stderr_message_handler((QtMsgType)&local_28,context_00,formattedMessage);
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qDefaultMessageHandler(QtMsgType type, const QMessageLogContext &context,
                                   const QString &message)
{
    // A message sink logs the message to a structured or unstructured destination,
    // optionally formatting the message if the latter, and returns true if the sink
    // handled stderr output as well, which will shortcut our default stderr output.

    if (systemMessageSink.messageIsUnformatted) {
        if (systemMessageSink.sink(type, context, message))
            return;
    }

    preformattedMessageHandler(type, context, formatLogMessage(type, context, message));
}